

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

JavascriptArray * __thiscall
JsrtDebugManager::GetScripts(JsrtDebugManager *this,ScriptContext *scriptContext)

{
  anon_class_32_4_013cec9a_for_mapper mapper;
  int iVar1;
  JavascriptLibrary *this_00;
  ThreadContext *this_01;
  byte local_59;
  ScriptContext *local_30;
  ScriptContext *tempScriptContext;
  JavascriptArray *pJStack_20;
  int index;
  JavascriptArray *scriptsArray;
  ScriptContext *scriptContext_local;
  JsrtDebugManager *this_local;
  
  scriptsArray = (JavascriptArray *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_00 = Js::ScriptContext::GetLibrary(scriptContext);
  pJStack_20 = Js::JavascriptLibrary::CreateArray(this_00);
  tempScriptContext._4_4_ = 0;
  this_01 = Js::ScriptContext::GetThreadContext((ScriptContext *)scriptsArray);
  local_30 = ThreadContext::GetScriptContextList(this_01);
  while( true ) {
    local_59 = 0;
    if (local_30 != (ScriptContext *)0x0) {
      iVar1 = (*(local_30->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
      local_59 = (byte)iVar1 ^ 0xff;
    }
    if ((local_59 & 1) == 0) break;
    mapper.scriptContext = (ScriptContext **)&scriptsArray;
    mapper.this = this;
    mapper.scriptsArray = &stack0xffffffffffffffe0;
    mapper.index = (int *)((long)&tempScriptContext + 4);
    Js::ScriptContext::MapScript<JsrtDebugManager::GetScripts(Js::ScriptContext*)::__0>
              (local_30,mapper);
    local_30 = local_30->next;
  }
  return pJStack_20;
}

Assistant:

Js::JavascriptArray* JsrtDebugManager::GetScripts(Js::ScriptContext* scriptContext)
{
    Js::JavascriptArray* scriptsArray = scriptContext->GetLibrary()->CreateArray();

    int index = 0;

    for (Js::ScriptContext *tempScriptContext = scriptContext->GetThreadContext()->GetScriptContextList();
    tempScriptContext != nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->MapScript([&](Js::Utf8SourceInfo* utf8SourceInfo)
        {
            if (!utf8SourceInfo->GetIsLibraryCode() && utf8SourceInfo->HasDebugDocument())
            {
                bool isCallerLibraryCode = false;

                bool isDynamic = utf8SourceInfo->IsDynamic();

                if (isDynamic)
                {
                    // If the code is dynamic (eval or new Function) only return the script if parent is non-library
                    Js::Utf8SourceInfo* callerUtf8SourceInfo = utf8SourceInfo->GetCallerUtf8SourceInfo();

                    while (callerUtf8SourceInfo != nullptr && !isCallerLibraryCode)
                    {
                        isCallerLibraryCode = callerUtf8SourceInfo->GetIsLibraryCode();
                        callerUtf8SourceInfo = callerUtf8SourceInfo->GetCallerUtf8SourceInfo();
                    }
                }

                if (!isCallerLibraryCode)
                {
                    Js::DynamicObject* sourceObj = this->GetScript(utf8SourceInfo);

                    if (sourceObj != nullptr)
                    {
                        Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, sourceObj);
                        scriptsArray->DirectSetItemAt(index, marshaledObj);
                        index++;
                    }
                }
            }
        });
    }

    return scriptsArray;
}